

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs7_test.cc
# Opt level: O2

void __thiscall PKCS7Test_SortCerts_Test::TestBody(PKCS7Test_SortCerts_Test *this)

{
  int iVar1;
  X509 *new_cert1;
  X509 *new_cert2;
  X509 *new_cert3;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  stack_st_X509 *message;
  char *in_R9;
  AssertHelper local_98;
  UniquePtr<struct_stack_st_X509> certs;
  AssertHelper local_88;
  AssertionResult gtest_ar_;
  anon_class_16_2_66b45f4d check_order;
  CBS pkcs7;
  string nss_p7c;
  
  GetTestData_abi_cxx11_(&nss_p7c,"crypto/pkcs7/test/nss.p7c");
  pkcs7.data = (uint8_t *)nss_p7c._M_dataplus._M_p;
  pkcs7.len = nss_p7c._M_string_length;
  certs._M_t.super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl =
       (__uniq_ptr_data<stack_st_X509,_bssl::internal::Deleter,_true,_true>)OPENSSL_sk_new_null();
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       (tuple<stack_st_X509_*,_bssl::internal::Deleter>)
       certs._M_t.super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl !=
       (_Head_base<0UL,_stack_st_X509_*,_false>)0x0;
  if ((tuple<stack_st_X509_*,_bssl::internal::Deleter>)
      certs._M_t.super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl ==
      (_Head_base<0UL,_stack_st_X509_*,_false>)0x0) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&check_order,(internal *)&gtest_ar_,(AssertionResult *)0x527c94,"false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
               ,0x126,(char *)check_order.nss_p7c);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_98);
LAB_002f7597:
    this_00 = &gtest_ar_.message_;
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    std::__cxx11::string::~string((string *)&check_order);
    if ((long *)CONCAT44(local_98.data_._4_4_,local_98.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_98.data_._4_4_,local_98.data_._0_4_) + 8))();
    }
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    iVar1 = PKCS7_get_certificates
                      ((stack_st_X509 *)
                       certs._M_t.super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>._M_t
                       .super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl,&pkcs7);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ = iVar1 != 0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)&local_98);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&check_order,(internal *)&gtest_ar_,
                 (AssertionResult *)"PKCS7_get_certificates(certs.get(), &pkcs7)","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_88,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                 ,0x127,(char *)check_order.nss_p7c);
      testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_98);
      goto LAB_002f7597;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    local_98.data_._0_4_ = 3;
    gtest_ar_._0_8_ =
         OPENSSL_sk_num((OPENSSL_STACK *)
                        certs._M_t.super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>.
                        _M_t.super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)&check_order,"3u","sk_X509_num(certs.get())",(uint *)&local_98,
               (unsigned_long *)&gtest_ar_);
    if ((char)check_order.nss_p7c != '\0') {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&check_order.certs);
      new_cert1 = (X509 *)OPENSSL_sk_value((OPENSSL_STACK *)
                                           certs._M_t.
                                           super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>
                                           .super__Head_base<0UL,_stack_st_X509_*,_false>.
                                           _M_head_impl,0);
      new_cert2 = (X509 *)OPENSSL_sk_value((OPENSSL_STACK *)
                                           certs._M_t.
                                           super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>
                                           .super__Head_base<0UL,_stack_st_X509_*,_false>.
                                           _M_head_impl,1);
      new_cert3 = (X509 *)OPENSSL_sk_value((OPENSSL_STACK *)
                                           certs._M_t.
                                           super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>
                                           .super__Head_base<0UL,_stack_st_X509_*,_false>.
                                           _M_head_impl,2);
      check_order.certs = &certs;
      check_order.nss_p7c = &nss_p7c;
      TestBody::anon_class_16_2_66b45f4d::operator()(&check_order,new_cert1,new_cert2,new_cert3);
      TestBody::anon_class_16_2_66b45f4d::operator()(&check_order,new_cert3,new_cert2,new_cert1);
      TestBody::anon_class_16_2_66b45f4d::operator()(&check_order,new_cert2,new_cert3,new_cert1);
      goto LAB_002f7628;
    }
    testing::Message::Message((Message *)&gtest_ar_);
    if (check_order.certs == (UniquePtr<struct_stack_st_X509> *)0x0) {
      message = (stack_st_X509 *)0x4951bf;
    }
    else {
      message = ((check_order.certs)->_M_t).
                super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
               ,0x128,(char *)message);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&gtest_ar_);
    this_00 = (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&check_order.certs;
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (gtest_ar_._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(this_00);
LAB_002f7628:
  std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::~unique_ptr(&certs);
  std::__cxx11::string::~string((string *)&nss_p7c);
  return;
}

Assistant:

TEST(PKCS7Test, SortCerts) {
  // nss.p7c contains three certificates in the canonical DER order.
  std::string nss_p7c = GetTestData("crypto/pkcs7/test/nss.p7c");
  CBS pkcs7 = bssl::StringAsBytes(nss_p7c);
  bssl::UniquePtr<STACK_OF(X509)> certs(sk_X509_new_null());
  ASSERT_TRUE(certs);
  ASSERT_TRUE(PKCS7_get_certificates(certs.get(), &pkcs7));
  ASSERT_EQ(3u, sk_X509_num(certs.get()));

  X509 *cert1 = sk_X509_value(certs.get(), 0);
  X509 *cert2 = sk_X509_value(certs.get(), 1);
  X509 *cert3 = sk_X509_value(certs.get(), 2);

  auto check_order = [&](X509 *new_cert1, X509 *new_cert2, X509 *new_cert3) {
    // Bundle the certificates in the new order.
    bssl::UniquePtr<STACK_OF(X509)> new_certs(sk_X509_new_null());
    ASSERT_TRUE(new_certs);
    ASSERT_TRUE(bssl::PushToStack(new_certs.get(), bssl::UpRef(new_cert1)));
    ASSERT_TRUE(bssl::PushToStack(new_certs.get(), bssl::UpRef(new_cert2)));
    ASSERT_TRUE(bssl::PushToStack(new_certs.get(), bssl::UpRef(new_cert3)));
    bssl::ScopedCBB cbb;
    ASSERT_TRUE(CBB_init(cbb.get(), nss_p7c.size()));
    ASSERT_TRUE(PKCS7_bundle_certificates(cbb.get(), new_certs.get()));

    // The bundle should be sorted back to the original order.
    CBS cbs;
    CBS_init(&cbs, CBB_data(cbb.get()), CBB_len(cbb.get()));
    bssl::UniquePtr<STACK_OF(X509)> result(sk_X509_new_null());
    ASSERT_TRUE(result);
    ASSERT_TRUE(PKCS7_get_certificates(result.get(), &cbs));
    ASSERT_EQ(sk_X509_num(certs.get()), sk_X509_num(result.get()));
    for (size_t i = 0; i < sk_X509_num(certs.get()); i++) {
      X509 *a = sk_X509_value(certs.get(), i);
      X509 *b = sk_X509_value(result.get(), i);
      EXPECT_EQ(0, X509_cmp(a, b));
    }
  };

  check_order(cert1, cert2, cert3);
  check_order(cert3, cert2, cert1);
  check_order(cert2, cert3, cert1);
}